

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O2

DTLSWriteEpoch * bssl::dtls_get_write_epoch(SSL *ssl,uint16_t epoch)

{
  DTLS1_STATE *pDVar1;
  DTLSWriteEpoch *pDVar2;
  long lVar3;
  
  pDVar1 = ssl->d1;
  if (*(uint16_t *)((long)&(pDVar1->write_epoch).next_record.combined_ + 6) == epoch) {
    return &pDVar1->write_epoch;
  }
  lVar3 = 0;
  do {
    if ((ulong)(pDVar1->extra_write_epochs).size_ * 8 == lVar3) {
      return (DTLSWriteEpoch *)0x0;
    }
    pDVar2 = *(DTLSWriteEpoch **)((pDVar1->extra_write_epochs).storage_ + lVar3);
    lVar3 = lVar3 + 8;
  } while (*(uint16_t *)((long)&(pDVar2->next_record).combined_ + 6) != epoch);
  return pDVar2;
}

Assistant:

DTLSWriteEpoch *dtls_get_write_epoch(const SSL *ssl, uint16_t epoch) {
  if (ssl->d1->write_epoch.epoch() == epoch) {
    return &ssl->d1->write_epoch;
  }
  for (const auto &e : ssl->d1->extra_write_epochs) {
    if (e->epoch() == epoch) {
      return e.get();
    }
  }
  return nullptr;
}